

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

optional<unsigned_long> soul::AST::Connection::getEndpointIndex(Expression *e)

{
  bool bVar1;
  ArrayElementRef *pAVar2;
  Expression *pEVar3;
  Constant *pCVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  optional<unsigned_long> oVar6;
  CompileMessage local_88;
  uint local_4c;
  int64_t local_48;
  pool_ptr<soul::AST::Constant> local_40;
  pool_ptr<soul::AST::Constant> c;
  pool_ptr<soul::AST::ArrayElementRef> local_28;
  pool_ptr<soul::AST::ArrayElementRef> sub;
  Expression *e_local;
  bool local_10;
  
  sub.object = (ArrayElementRef *)e;
  cast<soul::AST::ArrayElementRef,soul::AST::Expression>((soul *)&local_28,e);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_28);
  if (bVar1) {
    pAVar2 = pool_ptr<soul::AST::ArrayElementRef>::operator->(&local_28);
    checkAssertion((bool)(~pAVar2->isSlice & 1),"! sub->isSlice","getEndpointIndex",0x4d0);
    pAVar2 = pool_ptr<soul::AST::ArrayElementRef>::operator->(&local_28);
    pEVar3 = pool_ptr<soul::AST::Expression>::operator->(&pAVar2->startIndex);
    (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_40);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_40);
    if (bVar1) {
      pCVar4 = pool_ptr<soul::AST::Constant>::operator->(&local_40);
      local_48 = soul::Value::getAsInt64(&pCVar4->value);
      std::optional<unsigned_long>::optional<long,_true>
                ((optional<unsigned_long> *)&e_local,&local_48);
    }
    local_4c = (uint)bVar1;
    pool_ptr<soul::AST::Constant>::~pool_ptr(&local_40);
    if (local_4c == 0) {
      pEVar3 = &(sub.object)->super_Expression;
      Errors::endpointIndexMustBeConstant<>();
      Context::throwError(&(pEVar3->super_Statement).super_ASTObject.context,&local_88,false);
    }
  }
  else {
    local_4c = 0;
  }
  pool_ptr<soul::AST::ArrayElementRef>::~pool_ptr(&local_28);
  uVar5 = extraout_RDX;
  if (local_4c == 0) {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&e_local);
    uVar5 = extraout_RDX_00;
  }
  oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar5 >> 8);
  oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = local_10;
  oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload = (_Storage<unsigned_long,_true>)e_local;
  return (optional<unsigned_long>)
         oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

static std::optional<size_t> getEndpointIndex (Expression& e)
        {
            if (auto sub = cast<ArrayElementRef> (e))
            {
                SOUL_ASSERT (! sub->isSlice);

                if (auto c = sub->startIndex->getAsConstant())
                    return c->value.getAsInt64();

                e.context.throwError (Errors::endpointIndexMustBeConstant());
            }

            return {};
        }